

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parameters.c
# Opt level: O0

void parameters_dump(parameters *P,void *usr,parameter_print_func f)

{
  code *in_RDX;
  undefined8 in_RSI;
  undefined4 *in_RDI;
  
  (*in_RDX)(in_RSI,"K",*in_RDI);
  (*in_RDX)(in_RSI,"Kprime",in_RDI[1]);
  (*in_RDX)(in_RSI,"J",in_RDI[2]);
  (*in_RDX)(in_RSI,"L",in_RDI[3]);
  (*in_RDX)(in_RSI,"S",in_RDI[4]);
  (*in_RDX)(in_RSI,"H",in_RDI[5]);
  (*in_RDX)(in_RSI,"B",in_RDI[6]);
  (*in_RDX)(in_RSI,"W",in_RDI[7]);
  (*in_RDX)(in_RSI,"P",in_RDI[8]);
  (*in_RDX)(in_RSI,"P1",in_RDI[9]);
  (*in_RDX)(in_RSI,"U",in_RDI[10]);
  return;
}

Assistant:

void parameters_dump(const parameters* P, void* usr, parameter_print_func f)
{
#define pr(var)		do { (*f)(usr, #var, P->var); } while(0)
	pr(K);
	pr(Kprime);
	pr(J);
	pr(L);
	pr(S);
	pr(H);
	pr(B);
	pr(W);
	pr(P);
	pr(P1);
	pr(U);
#undef pr
}